

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiViewportP *pIVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  ImVec2 pos;
  
  pIVar4 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    id = GImGui->ActiveIdWindow->MoveId;
    if (id != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(id);
    if ((pIVar4->IO).MouseDown[0] != false) {
      return;
    }
LAB_00144332:
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  if ((pIVar4->MovingWindow == (ImGuiWindow *)0x0) ||
     (window = pIVar4->MovingWindow->RootWindowDockTree, window == (ImGuiWindow *)0x0)) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindowDockTree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0xf7a,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  bVar7 = true;
  if (window->WasActive == true) {
    bVar7 = window->Viewport == (ImGuiViewportP *)0x0;
  }
  if (((pIVar4->IO).MouseDown[0] != true) ||
     (bVar5 = IsMousePosValid(&(pIVar4->IO).MousePos), (~bVar5 & 1U) != 0 || bVar7)) {
    if (!bVar7) {
      if ((pIVar4->ConfigFlagsCurrFrame & 0x400) != 0) {
        UpdateTryMergeWindowIntoHostViewport(window,pIVar4->MouseViewport);
      }
      if ((GImGui->DragDropActive == true) && (GImGui->DragDropAcceptIdPrev != 0)) {
        pIVar6 = window->Viewport;
      }
      else {
        pIVar6 = window->Viewport;
        pIVar4->MouseViewport = pIVar6;
      }
      pIVar1 = &(pIVar6->super_ImGuiViewport).Flags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0x7f;
    }
    pIVar4->MovingWindow = (ImGuiWindow *)0x0;
    goto LAB_00144332;
  }
  IVar3 = (pIVar4->IO).MousePos;
  fVar8 = IVar3.x - (pIVar4->ActiveIdClickOffset).x;
  fVar9 = IVar3.y - (pIVar4->ActiveIdClickOffset).y;
  pos.y = fVar9;
  pos.x = fVar8;
  fVar2 = (window->Pos).x;
  if ((fVar2 == fVar8) && (!NAN(fVar2) && !NAN(fVar8))) {
    fVar2 = (window->Pos).y;
    if ((fVar2 == fVar9) && (!NAN(fVar2) && !NAN(fVar9))) goto LAB_001443b4;
  }
  IVar3.y = fVar9;
  IVar3.x = fVar8;
  MarkIniSettingsDirty(window);
  SetWindowPos(window,&pos,1);
  if (window->ViewportOwned == true) {
    (window->Viewport->super_ImGuiViewport).Pos = IVar3;
    ImGuiViewportP::UpdateWorkRect(window->Viewport);
  }
LAB_001443b4:
  FocusWindow(pIVar4->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindowDockTree);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindowDockTree;

        // When a window stop being submitted while being dragged, it may will its viewport until next Begin()
        const bool window_disappared = (!moving_window->WasActive || moving_window->Viewport == NULL);
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos) && !window_disappared)
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                {
                    moving_window->Viewport->Pos = pos;
                    moving_window->Viewport->UpdateWorkRect();
                }
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            if (!window_disappared)
            {
                // Try to merge the window back into the main viewport.
                // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
                if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                    UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

                // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
                if (!IsDragDropPayloadBeingAccepted())
                    g.MouseViewport = moving_window->Viewport;

                // Clear the NoInput window flag set by the Viewport system
                moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs; // FIXME-VIEWPORT: Test engine managed to crash here because Viewport was NULL.
            }

            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}